

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::ThreadGroup::run(TestStatus *__return_storage_ptr__,ThreadGroup *this)

{
  ThreadGroupThread *pTVar1;
  qpTestResult qVar2;
  pointer pSVar3;
  pointer pSVar4;
  ResultCollector resultCollector;
  string local_a0;
  undefined1 local_80 [80];
  
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_80);
  de::SpinBarrier::reset
            (&this->m_barrier,
             (deUint32)
             ((ulong)((long)(this->m_threads).
                            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_threads).
                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
  for (pSVar4 = (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 != (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
    pTVar1 = pSVar4->m_ptr;
    pTVar1->m_barrier = &this->m_barrier;
    de::Thread::start(&pTVar1->super_Thread);
  }
  for (pSVar3 = (this->m_threads).
                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar4; pSVar3 = pSVar3 + 1) {
    pTVar1 = pSVar3->m_ptr;
    de::Thread::join(&pTVar1->super_Thread);
    qVar2 = tcu::ResultCollector::getResult(&pTVar1->m_resultCollector);
    std::__cxx11::string::string
              ((string *)&local_a0,(string *)&(pTVar1->m_resultCollector).m_message);
    tcu::ResultCollector::addResult((ResultCollector *)local_80,qVar2,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    pSVar4 = (this->m_threads).
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_80);
  std::__cxx11::string::string((string *)&local_a0,(string *)(local_80 + 0x30));
  __return_storage_ptr__->m_code = qVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&local_a0)
  ;
  std::__cxx11::string::~string((string *)&local_a0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ThreadGroup::run (void)
{
	tcu::ResultCollector	resultCollector;

	m_barrier.reset((int)m_threads.size());

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
		(*threadIter)->start(&m_barrier);

	for (ThreadVector::iterator threadIter = m_threads.begin(); threadIter != m_threads.end(); ++threadIter)
	{
		tcu::ResultCollector&	threadResult	= (*threadIter)->getResultCollector();
		(*threadIter)->join();
		resultCollector.addResult(threadResult.getResult(), threadResult.getMessage());
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}